

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O2

void __thiscall t_netstd_generator::generate_service(t_netstd_generator *this,t_service *tservice)

{
  string *__rhs;
  int *piVar1;
  int expected;
  ostream *poVar2;
  int __oflag;
  t_netstd_generator *this_00;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_> *out;
  string f_service_name;
  ofstream_with_content_based_conditional_update f_service;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_268;
  undefined1 local_248 [32];
  string local_228;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_> local_1c8;
  
  expected = (this->super_t_oop_generator).super_t_generator.indent_;
  std::operator+(&bStack_268,&this->namespace_dir_,"/");
  __rhs = &(this->super_t_oop_generator).super_t_generator.service_name_;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c8,
                 &bStack_268,__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_248 + 0x60),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c8,
                 ".cs");
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&bStack_268);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update(&local_1c8);
  std::__cxx11::string::string
            ((string *)&bStack_268,local_1e8._M_dataplus._M_p,(allocator *)local_248);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&local_1c8,(char *)&bStack_268,__oflag);
  std::__cxx11::string::~string((string *)&bStack_268);
  reset_indent(this);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&bStack_268,this);
  poVar2 = std::operator<<((ostream *)&local_1c8,(string *)&bStack_268);
  netstd_type_usings_abi_cxx11_((string *)local_248,this);
  this_00 = (t_netstd_generator *)local_248;
  poVar2 = std::operator<<(poVar2,(string *)this_00);
  netstd_thrift_usings_abi_cxx11_((string *)(local_248 + 0x20),this_00);
  poVar2 = std::operator<<(poVar2,(string *)(local_248 + 0x20));
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)(local_248 + 0x20));
  std::__cxx11::string::~string((string *)local_248);
  std::__cxx11::string::~string((string *)&bStack_268);
  start_netstd_namespace(this,(ostream *)&local_1c8);
  t_generator::indent_abi_cxx11_(&bStack_268,(t_generator *)this);
  poVar2 = std::operator<<((ostream *)&local_1c8,(string *)&bStack_268);
  poVar2 = std::operator<<(poVar2,"public partial class ");
  std::__cxx11::string::string((string *)(local_248 + 0x40),(string *)__rhs);
  normalize_name((string *)local_248,this,(string *)(local_248 + 0x40),false);
  poVar2 = std::operator<<(poVar2,(string *)local_248);
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_((string *)(local_248 + 0x20),(t_generator *)this);
  poVar2 = std::operator<<(poVar2,(string *)(local_248 + 0x20));
  poVar2 = std::operator<<(poVar2,"{");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)(local_248 + 0x20));
  std::__cxx11::string::~string((string *)local_248);
  std::__cxx11::string::~string((string *)(local_248 + 0x40));
  std::__cxx11::string::~string((string *)&bStack_268);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  generate_service_interface(this,(ostream *)&local_1c8,tservice);
  generate_service_client(this,(ostream *)&local_1c8,tservice);
  generate_service_server(this,(ostream *)&local_1c8,tservice);
  generate_service_helpers(this,(ostream *)&local_1c8,tservice);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&bStack_268,(t_generator *)this);
  poVar2 = std::operator<<((ostream *)&local_1c8,(string *)&bStack_268);
  poVar2 = std::operator<<(poVar2,"}");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&bStack_268);
  out = &local_1c8;
  end_netstd_namespace(this,(ostream *)out);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (&local_1c8,(int)out);
  t_generator::indent_validate((t_generator *)this,expected,"generate_service.");
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update(&local_1c8);
  std::__cxx11::string::~string((string *)(local_248 + 0x60));
  return;
}

Assistant:

void t_netstd_generator::generate_service(t_service* tservice)
{
    int ic = indent_count();

    string f_service_name = namespace_dir_ + "/" + service_name_ + ".cs";
    ofstream_with_content_based_conditional_update f_service;
    f_service.open(f_service_name.c_str());

    reset_indent();
    f_service << autogen_comment() << netstd_type_usings() << netstd_thrift_usings() << endl;

    start_netstd_namespace(f_service);

    f_service << indent() << "public partial class " << normalize_name(service_name_) << endl
              << indent() << "{" << endl;
    indent_up();

    generate_service_interface(f_service, tservice);
    generate_service_client(f_service, tservice);
    generate_service_server(f_service, tservice);
    generate_service_helpers(f_service, tservice);

    indent_down();
    f_service << indent() << "}" << endl;

    end_netstd_namespace(f_service);
    f_service.close();

    indent_validate(ic, "generate_service.");
}